

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O1

void print_error<char[14]>(Printer *printer,char (*t) [14])

{
  char *local_70;
  Format<const_char_*> local_68;
  PrintTuple<char[6],_Format<const_char_*>,_char[6]> local_50;
  PrintTuple<char[5],_PrintTuple<char[6],_Format<const_char_*>,_char[6]>,_char[6]> local_30;
  
  local_68.t.t0 = &local_70;
  local_70 = "error";
  local_50.t.t0 = &local_68;
  local_68.s = "%: ";
  local_30.t.t0 = &local_50;
  local_50.t0 = (char (*) [6])0x13aaeb;
  local_50.t.t.t0 = (char (*) [6])0x13a6ab;
  local_30.t0 = (char (*) [5])0x13a69a;
  local_30.t.t.t0 = (char (*) [6])0x13a69f;
  PrintTuple<char[5],_PrintTuple<char[6],_Format<const_char_*>,_char[6]>,_char[6]>::print
            (&local_30,printer);
  StringView::strchr(*t,0);
  std::ostream::write((char *)printer->ostream,(long)t);
  std::ostream::put((char)printer->ostream);
  return;
}

Assistant:

void print_error(const Printer& printer, const char* path, std::size_t source_position, const T& t) {
	print_message(printer, path, source_position, red, "error", t);
}